

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# family.h
# Opt level: O0

Info * __thiscall
prometheus::Family<prometheus::Info>::Add<>(Family<prometheus::Info> *this,Labels *labels)

{
  Info *pIVar1;
  unique_ptr<prometheus::Info,_std::default_delete<prometheus::Info>_> local_20;
  Labels *local_18;
  Labels *labels_local;
  Family<prometheus::Info> *this_local;
  
  local_18 = labels;
  labels_local = (Labels *)this;
  detail::make_unique<prometheus::Info>();
  pIVar1 = Add(this,labels,&local_20);
  std::unique_ptr<prometheus::Info,_std::default_delete<prometheus::Info>_>::~unique_ptr(&local_20);
  return pIVar1;
}

Assistant:

T& Add(const Labels& labels, Args&&... args) {
    return Add(labels, detail::make_unique<T>(args...));
  }